

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InMemMsgLoader.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::InMemMsgLoader::loadMsg
          (InMemMsgLoader *this,XMLMsgId msgToLoad,XMLCh *toFill,XMLSize_t maxChars,XMLCh *repText1,
          XMLCh *repText2,XMLCh *repText3,XMLCh *repText4,MemoryManager *manager)

{
  uint uVar1;
  bool bVar2;
  XMLCh *repText2_local;
  XMLCh *repText1_local;
  XMLSize_t maxChars_local;
  XMLCh *toFill_local;
  XMLMsgId msgToLoad_local;
  InMemMsgLoader *this_local;
  
  uVar1 = (*(this->super_XMLMsgLoader)._vptr_XMLMsgLoader[2])(this,(ulong)msgToLoad,toFill,maxChars)
  ;
  bVar2 = (uVar1 & 1) != 0;
  if (bVar2) {
    XMLString::replaceTokens(toFill,maxChars,repText1,repText2,repText3,repText4,manager);
  }
  return bVar2;
}

Assistant:

bool InMemMsgLoader::loadMsg(const  XMLMsgLoader::XMLMsgId  msgToLoad
                            ,       XMLCh* const            toFill
                            , const XMLSize_t               maxChars
                            , const XMLCh* const            repText1
                            , const XMLCh* const            repText2
                            , const XMLCh* const            repText3
                            , const XMLCh* const            repText4
                            , MemoryManager* const          manager)
{
    // Call the other version to load up the message
    if (!loadMsg(msgToLoad, toFill, maxChars))
        return false;

    // And do the token replacement
    XMLString::replaceTokens(toFill, maxChars, repText1, repText2, repText3, repText4, manager);
    return true;
}